

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Formatter *format,Options *options)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  Options *in_RCX;
  string *enumname;
  Descriptor *class_desc;
  EnumDescriptor *enum_desc;
  cpp *local_78;
  string local_70;
  string local_50;
  
  for (p_Var1 = (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->enums_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    in_RCX = (Options *)(p_Var1 + 1);
    local_70._M_dataplus._M_p = *(pointer *)(p_Var1 + 2);
    Formatter::operator()
              (format,"enum ${1$$2$$}$ : int;\nbool $2$_IsValid(int value);\n",
               (EnumDescriptor **)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
  }
  for (p_Var2 = (this->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->classes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_78 = *(cpp **)(p_Var2 + 2);
    DefaultInstanceType_abi_cxx11_(&local_70,local_78,(Descriptor *)options,in_RCX);
    DefaultInstanceName_abi_cxx11_(&local_50,local_78,(Descriptor *)options,in_RCX);
    in_RCX = (Options *)(p_Var2 + 1);
    Formatter::operator()
              (format,"class ${1$$2$$}$;\nstruct $3$;\n$dllexport_decl $extern $3$ $4$;\n",
               (Descriptor **)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,&local_70
               ,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Print(const Formatter& format, const Options& options) const {
    for (const auto& p : enums_) {
      const std::string& enumname = p.first;
      const EnumDescriptor* enum_desc = p.second;
      format(
          "enum ${1$$2$$}$ : int;\n"
          "bool $2$_IsValid(int value);\n",
          enum_desc, enumname);
    }
    for (const auto& p : classes_) {
      const std::string& classname = p.first;
      const Descriptor* class_desc = p.second;
      format(
          "class ${1$$2$$}$;\n"
          "struct $3$;\n"
          "$dllexport_decl $extern $3$ $4$;\n",
          class_desc, classname, DefaultInstanceType(class_desc, options),
          DefaultInstanceName(class_desc, options));
    }
  }